

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

void __thiscall Clasp::SharedMinimizeData::resetBounds(SharedMinimizeData *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  LowerType *pLVar4;
  pointer pLVar5;
  size_type *psVar6;
  size_type *psVar7;
  ulong uVar8;
  size_type *psVar9;
  SharedMinimizeData *pSVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  size_type *psVar14;
  Fill<long> local_38;
  long local_30;
  
  LOCK();
  (this->gCount_).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  this->optGen_ = 0;
  uVar8 = (ulong)(this->adjust_).ebo_.size;
  if (uVar8 != 0) {
    pLVar4 = this->lower_;
    lVar11 = 0;
    do {
      LOCK();
      *(undefined8 *)((long)&(pLVar4->super___atomic_base<long>)._M_i + lVar11) = 0;
      UNLOCK();
      lVar11 = lVar11 + 8;
    } while (uVar8 << 3 != lVar11);
  }
  uVar1 = (this->adjust_).ebo_.size;
  local_30 = 0x7fffffffffffffff;
  this->up_[0].ebo_.size = 0;
  local_38.val_ = &local_30;
  bk_lib::pod_vector<long,std::allocator<long>>::
  insert_impl<unsigned_int,bk_lib::detail::Fill<long>>
            ((pod_vector<long,std::allocator<long>> *)this->up_,this->up_[0].ebo_.buf,uVar1,
             &local_38);
  uVar1 = (this->adjust_).ebo_.size;
  local_30 = 0x7fffffffffffffff;
  this->up_[1].ebo_.size = 0;
  local_38.val_ = &local_30;
  bk_lib::pod_vector<long,std::allocator<long>>::
  insert_impl<unsigned_int,bk_lib::detail::Fill<long>>
            ((pod_vector<long,std::allocator<long>> *)(this->up_ + 1),this->up_[1].ebo_.buf,uVar1,
             &local_38);
  uVar1 = (this->weights).ebo_.size;
  if (uVar1 != 0) {
    pSVar10 = this + 1;
    uVar13 = 0;
    do {
      pLVar5 = (this->weights).ebo_.buf;
      uVar8 = (ulong)uVar13;
      iVar2 = *(int *)(pLVar5 + uVar13);
      uVar12 = uVar13;
      while (iVar2 < 0) {
        uVar12 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar12;
        if (pLVar5[uVar8].weight < 0) {
          psVar6 = &pSVar10[-1].prios.ebo_.size;
          psVar7 = &(pSVar10->adjust_).ebo_.cap;
          do {
            psVar14 = psVar7;
            psVar9 = psVar6;
            pSVar10 = (SharedMinimizeData *)(psVar9 + 2);
            psVar6 = (size_type *)pSVar10;
            psVar7 = psVar14 + 2;
          } while (psVar9[3] != uVar13);
          uVar3 = psVar9[3];
          while (uVar3 == uVar13) {
            pLVar5 = (this->weights).ebo_.buf;
            LOCK();
            this->lower_[*(uint *)(pLVar5 + uVar8) & 0x7fffffff].super___atomic_base<long>._M_i =
                 this->lower_[*(uint *)(pLVar5 + uVar8) & 0x7fffffff].super___atomic_base<long>._M_i
                 + (long)pLVar5[uVar8].weight;
            UNLOCK();
            uVar3 = *psVar14;
            psVar14 = psVar14 + 2;
          }
        }
        pLVar5 = (this->weights).ebo_.buf;
        iVar2 = *(int *)(pLVar5 + uVar12);
      }
      uVar13 = uVar12 + 1;
    } while (uVar13 != uVar1);
  }
  return;
}

Assistant:

void SharedMinimizeData::resetBounds() {
	gCount_  = 0;
	optGen_  = 0;
	std::fill_n(lower_, numRules(), wsum_t(0));
	up_[0].assign(numRules(), maxBound());
	up_[1].assign(numRules(), maxBound());
	const WeightLiteral* lit = lits;
	for (weight_t wPos = 0, end = (weight_t)weights.size(), x; wPos != end; wPos = x+1) {
		assert(weights[wPos].weight >= 0);
		for (x = wPos; weights[x].next; ) { // compound weight - check for negative
			if (weights[++x].weight < 0) {
				while (lit->second != wPos) { ++lit; }
				for (const WeightLiteral* t = lit; t->second == wPos; ++t) {
					lower_[weights[x].level] += weights[x].weight;
				}
			}
		}
	}
}